

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O2

int SUNNonlinSolFree(SUNNonlinearSolver NLS)

{
  int iVar1;
  SUNNonlinearSolver_Ops __ptr;
  
  if (NLS != (SUNNonlinearSolver)0x0) {
    __ptr = NLS->ops;
    if ((__ptr != (SUNNonlinearSolver_Ops)0x0) &&
       (__ptr->free != (_func_int_SUNNonlinearSolver *)0x0)) {
      iVar1 = (*__ptr->free)(NLS);
      return iVar1;
    }
    if (NLS->content != (void *)0x0) {
      free(NLS->content);
      NLS->content = (void *)0x0;
      __ptr = NLS->ops;
    }
    free(__ptr);
    free(NLS);
  }
  return 0;
}

Assistant:

int SUNNonlinSolFree(SUNNonlinearSolver NLS)
{
  if (NLS == NULL) return(SUN_NLS_SUCCESS);

  /* if the free operation exists use it */
  if (NLS->ops)
    if (NLS->ops->free) return(NLS->ops->free(NLS));

  /* if we reach this point, either ops == NULL or free == NULL,
     try to cleanup by freeing the content, ops, and solver */
  if (NLS->content) { free(NLS->content); NLS->content = NULL; }
  if (NLS->ops) { free(NLS->ops); NLS->ops = NULL; }
  free(NLS); NLS = NULL;

  return(SUN_NLS_SUCCESS);
}